

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToLocalWideUnicode::map_utf8z
          (CCharmapToLocalWideUnicode *this,char *dest,size_t dest_len,utf8_ptr src)

{
  wchar_t wVar1;
  size_t sVar2;
  
  wVar1 = utf8_ptr::s_getch(src.p_);
  sVar2 = 0;
  while (wVar1 != L'\0') {
    if (dest_len < 4) {
      dest_len = 0;
    }
    else {
      wVar1 = utf8_ptr::s_getch(src.p_);
      *(wchar_t *)dest = wVar1;
      dest = (char *)((long)dest + 4);
      dest_len = dest_len - 4;
    }
    sVar2 = sVar2 + 4;
    src.p_ = src.p_ + (ulong)((((byte)*src.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*src.p_ >> 7) * 3)
                      + 1;
    wVar1 = utf8_ptr::s_getch(src.p_);
  }
  if (3 < dest_len) {
    *(wchar_t *)dest = L'\0';
  }
  return sVar2;
}

Assistant:

size_t CCharmapToLocalWideUnicode::
   map_utf8z(char *dest, size_t dest_len, utf8_ptr src) const
{
    size_t cur_total;
    wchar_t *destw;

    /* set up a wchar_t output pointer for convenience */
    destw = (wchar_t *)dest;

    /* copy characters until we find the terminating null */
    for (cur_total = 0 ; src.getch() != 0 ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest_len >= sizeof(wchar_t))
        {
            /* add the sequence */
            *destw++ = src.getch();

            /* adjust the length remaining */
            dest_len -= sizeof(wchar_t);
        }
        else
        {
            /* it doesn't fit - zero the output length remaining */
            dest_len = 0;
        }

        /* count the length in the total */
        cur_total += sizeof(wchar_t);
    }

    /* 
     *   if there's room for a null terminator character (not byte - we need
     *   to add an entire wide character), add it, but don't count it in the
     *   return length 
     */
    if (dest_len >= sizeof(wchar_t))
        *destw = '\0';
    
    /* return the total length of the result */
    return cur_total;
}